

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell.h
# Opt level: O3

CellGeometry * __thiscall
CIF::UnitCell::getCellGeometry(CellGeometry *__return_storage_ptr__,UnitCell *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = (this->geometry).a;
  dVar2 = (this->geometry).b;
  dVar3 = (this->geometry).c;
  dVar4 = (this->geometry).alpha;
  dVar5 = (this->geometry).gamma;
  __return_storage_ptr__->beta = (this->geometry).beta;
  __return_storage_ptr__->gamma = dVar5;
  __return_storage_ptr__->c = dVar3;
  __return_storage_ptr__->alpha = dVar4;
  __return_storage_ptr__->a = dVar1;
  __return_storage_ptr__->b = dVar2;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->avec,&(this->geometry).avec);
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->bvec,&(this->geometry).bvec);
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->cvec,&(this->geometry).cvec);
  return __return_storage_ptr__;
}

Assistant:

CellGeometry getCellGeometry() { return geometry; }